

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerspectiveMatrix.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar2;
  ulong uVar3;
  size_t j;
  long lVar4;
  float fovy;
  Vec2f VVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar8;
  Vec3f VVar9;
  col_type cVar10;
  Vec2f uv [3];
  TGAImage texture;
  TGAImage framebuffer;
  vector<int,_std::allocator<int>_> face;
  col_type local_1f0;
  string texture_path;
  string model_path;
  TinyRender render;
  Vec3f triangle [3];
  Matrix projectMatrix;
  Matrix viewMatrix;
  Model model;
  undefined8 extraout_XMM0_Qb;
  
  TRM::TGAImage::TGAImage(&framebuffer,800,600,3);
  model.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_1_ = 4;
  model.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xff000000;
  TRM::TGAImage::clearColor(&framebuffer,(TGAColor *)&model);
  render._vptr_TinyRender = (_func_int **)&PTR__TinyRender_0010bd10;
  render.mImage = (TGAImage *)0x0;
  render.mZBuffer = (float *)0x0;
  TRM::TinyRender::attachBuffer(&render,&framebuffer);
  std::operator+(&model_path,&ASSETS_ROOT_abi_cxx11_,"/african_head.obj");
  std::operator+(&texture_path,&ASSETS_ROOT_abi_cxx11_,"/african_head_diffuse.tga");
  TRM::Model::Model(&model,model_path._M_dataplus._M_p);
  TRM::TGAImage::TGAImage(&texture);
  TRM::TGAImage::read_tga_file(&texture,texture_path._M_dataplus._M_p);
  TRM::TGAImage::flip_vertically(&texture);
  VVar9.field_2.z = 1.0;
  VVar9.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  VVar9.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  TRM::lookAt(&viewMatrix,VVar9,(Vec3f)ZEXT412(0),(Vec3f)ZEXT812(0x3f80000000000000));
  fovy = TRM::degToRadian(60.0);
  TRM::perspective(&projectMatrix,fovy,1.3333334,0.1,1000.0);
  uVar3 = 0;
  while( true ) {
    iVar1 = TRM::Model::nfaces(&model);
    if ((ulong)(long)iVar1 <= uVar3) break;
    iVar1 = (int)uVar3;
    TRM::Model::face(&face,&model,iVar1);
    paVar2 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)&triangle[0].field_2;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      VVar9 = TRM::Model::vert(&model,face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar4]);
      uv[0] = VVar9._0_8_;
      uv[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)VVar9.field_2;
      uv[1].field_1.y = 1.0;
      local_1f0 = glm::operator*(&viewMatrix,(row_type *)uv);
      cVar10 = glm::operator*(&projectMatrix,&local_1f0);
      aVar8 = cVar10.field_3;
      auVar6._0_8_ = cVar10._0_8_;
      auVar6._8_8_ = extraout_XMM0_Qb;
      auVar7._4_4_ = aVar8;
      auVar7._0_4_ = aVar8;
      auVar7._8_4_ = aVar8;
      auVar7._12_4_ = aVar8;
      auVar7 = divps(auVar6,auVar7);
      *(ulong *)(paVar2 + -2) =
           CONCAT44((auVar7._4_4_ + 1.0) * 600.0 * 0.5 + 0.5,
                    (auVar7._0_4_ + 1.0) * 800.0 * 0.5 + 0.5);
      *paVar2 = aVar8;
      paVar2 = paVar2 + 3;
    }
    uv[0] = TRM::Model::uv(&model,iVar1,0);
    VVar5 = TRM::Model::uv(&model,iVar1,1);
    uv[1].field_0 = VVar5.field_0;
    uv[1].field_1 = VVar5.field_1;
    uv[2] = TRM::Model::uv(&model,iVar1,2);
    TRM::TinyRender::triangle(&render,triangle,uv,&texture);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&face.super__Vector_base<int,_std::allocator<int>_>);
    uVar3 = uVar3 + 1;
  }
  TRM::TGAImage::flip_vertically(&framebuffer);
  TRM::TGAImage::write_png_stb(&framebuffer,"framebuffer.png");
  TRM::TGAImage::~TGAImage(&texture);
  TRM::Model::~Model(&model);
  std::__cxx11::string::~string((string *)&texture_path);
  std::__cxx11::string::~string((string *)&model_path);
  TRM::TGAImage::~TGAImage(&framebuffer);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {

    TGAImage framebuffer(WIDTH, HEIGHT, TGAImage::RGB);
    framebuffer.clearColor(TGAColor(0, 0, 0));

    TinyRender render;
    render.attachBuffer(&framebuffer);
    
    std::string model_path = ASSETS_ROOT + "/african_head.obj";
    std::string texture_path = ASSETS_ROOT + "/african_head_diffuse.tga";
    
    Model model(model_path.c_str());


    TGAImage texture;
    texture.read_tga_file(texture_path.c_str());
    texture.flip_vertically();

    Vec3f eye;
    eye[0] = 1.f;
    eye[1] = 0.f;
    eye[2] = 1.f;

    Vec3f center;
    center[0] = 0.f;
    center[1] = 0.f;
    center[2] = 0.f;
    TRM::Vec3f up;
    up[0] = 0.0f;
    up[1] = 1.f;
    up[2] = 0.f;

    Matrix viewMatrix = lookAt(eye, center, up);
    Matrix projectMatrix = perspective(degToRadian(60.0f), 4.f / 3.f, 0.1f, 1000.0f);

    /** draw all vertex triangle ***/
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::vector<int> face = model.face(i);
        Vec3f triangle[3];
        for(size_t j = 0; j < 3; j++) {
            Vec3f c = model.vert(face[j]);
            Vec4f cp;
            cp[0] = c[0];
            cp[1] = c[1];
            cp[2] = c[2];
            cp[3] = 1.f;
            Vec4f pr = projectMatrix * (viewMatrix * cp);
            c[0] = pr[0] / pr[3];
            c[1] = pr[1] / pr[3];
            c[2] = pr[3];

            c[0] = (c[0] + 1.f) * WIDTH / 2.f + .5f;
            c[1] = (c[1] + 1.f) * HEIGHT / 2.f + .5f;
            triangle[j][0] = c[0];
            triangle[j][1] = c[1];
            triangle[j][2] = c[2];
        }


        Vec2f uv[] = { model.uv(i, 0), model.uv(i, 1), model.uv(i, 2) };
        render.triangle(triangle, uv, &texture);
    }
    
    framebuffer.flip_vertically();
    framebuffer.write_png_stb("framebuffer.png");

    return 0;
}